

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_1U,_4U>::Init(WavingSketch<8U,_1U,_4U> *this,Data<4U> *from,Data<4U> *to)

{
  byte bVar1;
  ulong uVar2;
  uint position;
  uint uVar3;
  uint i;
  uint num;
  bool bVar4;
  Stream<4U> stream;
  
  stream.str._4_4_ = *(undefined4 *)to->str;
  stream.str._0_4_ = *(undefined4 *)from->str;
  bVar4 = true;
  for (num = 0; num < this->HASH_NUM; num = num + 1) {
    uVar3 = Stream<4U>::Hash(&stream,num);
    uVar2 = (ulong)uVar3 % (ulong)this->LENGTH;
    bVar1 = *(byte *)(*(long *)(this->bitset + 8) + (uVar2 >> 3));
    if ((bVar1 >> ((uint)uVar2 & 7) & 1) == 0) {
      *(byte *)(*(long *)(this->bitset + 8) + (uVar2 >> 3)) = (byte)(1 << ((byte)uVar2 & 7)) | bVar1
      ;
      bVar4 = false;
    }
  }
  if (!bVar4) {
    (**(this->super_Abstract<4U>)._vptr_Abstract)(this,from);
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& from, const Data<DATA_LEN>& to) {
		Stream<DATA_LEN> stream(from, to);

		bool init = true;
		for (uint i = 0; i < HASH_NUM; ++i) {
			uint position = stream.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		if (!init) Init(from);
	}